

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conncache.c
# Opt level: O2

void cpool_discard_conn(cpool *cpool,Curl_easy *data,connectdata *conn,_Bool aborted)

{
  long lVar1;
  CURLMcode CVar2;
  size_t sVar3;
  Curl_llist_node *n;
  connectdata *conn_00;
  bool bVar4;
  _Bool done;
  _Bool local_d1;
  sigpipe_ignore local_d0;
  
  local_d1 = false;
  sVar3 = Curl_llist_count(&conn->easyq);
  if (sVar3 != 0 && !aborted) {
    return;
  }
  bVar4 = conn->connect_only != '\0';
  conn->bits = (ConnectBits)
               ((ulong)conn->bits & 0xffffffffbfffffff | (ulong)((uint)(bVar4 || aborted) << 0x1e));
  if (!bVar4 && !aborted) {
    Curl_attach_connection(data,conn);
    cpool_run_conn_shutdown(data,conn,&local_d1);
    Curl_detach_connection(data);
    if ((local_d1 & 1U) == 0) {
      if (data->multi != (Curl_multi *)0x0) {
        lVar1 = data->multi->max_shutdown_connections;
        if (0 < lVar1) {
          sVar3 = Curl_llist_count(&cpool->shutdowns);
          if (((long)sVar3 <= lVar1) &&
             (n = Curl_llist_head(&cpool->shutdowns), n != (Curl_llist_node *)0x0)) {
            conn_00 = (connectdata *)Curl_node_elem(n);
            Curl_node_remove(n);
            memset(&local_d0,0,0xa0);
            local_d0.no_signal = true;
            sigpipe_apply(cpool->idata,&local_d0);
            cpool_close_and_destroy(cpool,conn_00,(Curl_easy *)0x0,false);
            sigpipe_restore(&local_d0);
          }
        }
        if ((data->multi != (Curl_multi *)0x0) &&
           (data->multi->socket_cb != (curl_socket_callback)0x0)) {
          *(undefined8 *)((conn->shutdown_poll).sockets + 4) = 0;
          (conn->shutdown_poll).actions[0] = '\0';
          (conn->shutdown_poll).actions[1] = '\0';
          (conn->shutdown_poll).actions[2] = '\0';
          (conn->shutdown_poll).actions[3] = '\0';
          (conn->shutdown_poll).actions[4] = '\0';
          *(undefined3 *)&(conn->shutdown_poll).field_0x1d = 0;
          (conn->shutdown_poll).sockets[0] = 0;
          (conn->shutdown_poll).sockets[1] = 0;
          (conn->shutdown_poll).sockets[2] = 0;
          (conn->shutdown_poll).sockets[3] = 0;
          CVar2 = cpool_update_shutdown_ev(data->multi,cpool->idata,conn);
          if (CVar2 != CURLM_OK) {
            cpool_close_and_destroy(cpool,conn,data,false);
            return;
          }
        }
      }
      Curl_llist_append(&cpool->shutdowns,conn,&conn->cpool_node);
      return;
    }
  }
  cpool_close_and_destroy(cpool,conn,data,false);
  return;
}

Assistant:

static void cpool_discard_conn(struct cpool *cpool,
                               struct Curl_easy *data,
                               struct connectdata *conn,
                               bool aborted)
{
  bool done = FALSE;

  DEBUGASSERT(data);
  DEBUGASSERT(cpool);
  DEBUGASSERT(!conn->bits.in_cpool);

  /*
   * If this connection is not marked to force-close, leave it open if there
   * are other users of it
   */
  if(CONN_INUSE(conn) && !aborted) {
    DEBUGF(infof(data, "[CCACHE] not discarding #%" FMT_OFF_T
                 " still in use by %zu transfers", conn->connection_id,
                 CONN_INUSE(conn)));
    return;
  }

  /* treat the connection as aborted in CONNECT_ONLY situations, we do
   * not know what the APP did with it. */
  if(conn->connect_only)
    aborted = TRUE;
  conn->bits.aborted = aborted;

  /* We do not shutdown dead connections. The term 'dead' can be misleading
   * here, as we also mark errored connections/transfers as 'dead'.
   * If we do a shutdown for an aborted transfer, the server might think
   * it was successful otherwise (for example an ftps: upload). This is
   * not what we want. */
  if(aborted)
    done = TRUE;
  if(!done) {
    /* Attempt to shutdown the connection right away. */
    Curl_attach_connection(data, conn);
    cpool_run_conn_shutdown(data, conn, &done);
    DEBUGF(infof(data, "[CCACHE] shutdown #%" FMT_OFF_T ", done=%d",
                 conn->connection_id, done));
    Curl_detach_connection(data);
  }

  if(done) {
    cpool_close_and_destroy(cpool, conn, data, FALSE);
    return;
  }

  /* Add the connection to our shutdown list for non-blocking shutdown
   * during multi processing. */
  if(data->multi && data->multi->max_shutdown_connections > 0 &&
     (data->multi->max_shutdown_connections >=
      (long)Curl_llist_count(&cpool->shutdowns))) {
    DEBUGF(infof(data, "[CCACHE] discarding oldest shutdown connection "
                       "due to limit of %ld",
                       data->multi->max_shutdown_connections));
    cpool_shutdown_destroy_oldest(cpool);
  }

  if(data->multi && data->multi->socket_cb) {
    DEBUGASSERT(cpool == &data->multi->cpool);
    /* Start with an empty shutdown pollset, so out internal closure handle
     * is added to the sockets. */
    memset(&conn->shutdown_poll, 0, sizeof(conn->shutdown_poll));
    if(cpool_update_shutdown_ev(data->multi, cpool->idata, conn)) {
      DEBUGF(infof(data, "[CCACHE] update events for shutdown failed, "
                   "discarding #%" FMT_OFF_T,
                   conn->connection_id));
      cpool_close_and_destroy(cpool, conn, data, FALSE);
      return;
    }
  }

  Curl_llist_append(&cpool->shutdowns, conn, &conn->cpool_node);
  DEBUGF(infof(data, "[CCACHE] added #%" FMT_OFF_T
               " to shutdown list of length %zu", conn->connection_id,
               Curl_llist_count(&cpool->shutdowns)));
}